

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.c
# Opt level: O1

bc_slist_t * blogc_split_list_variable(char *name,bc_trie_t *global,bc_trie_t *local)

{
  char *pcVar1;
  char **__ptr;
  bc_slist_t *l;
  char **ppcVar2;
  
  pcVar1 = blogc_get_variable(name,global,local);
  l = (bc_slist_t *)0x0;
  if (pcVar1 != (char *)0x0) {
    __ptr = bc_str_split(pcVar1,' ',0);
    pcVar1 = *__ptr;
    if (pcVar1 != (char *)0x0) {
      l = (bc_slist_t *)0x0;
      ppcVar2 = __ptr;
      do {
        ppcVar2 = ppcVar2 + 1;
        if (*pcVar1 == '\0') {
          free(pcVar1);
        }
        else {
          l = bc_slist_append(l,pcVar1);
        }
        pcVar1 = *ppcVar2;
      } while (pcVar1 != (char *)0x0);
    }
    free(__ptr);
  }
  return l;
}

Assistant:

bc_slist_t*
blogc_split_list_variable(const char *name, bc_trie_t *global, bc_trie_t *local)
{
    const char *value = blogc_get_variable(name, global, local);
    if (value == NULL)
        return NULL;

    bc_slist_t *rv = NULL;

    char **tmp = bc_str_split(value, ' ', 0);
    for (size_t i = 0; tmp[i] != NULL; i++) {
        if (tmp[i][0] != '\0')  // ignore empty strings
            rv = bc_slist_append(rv, tmp[i]);
        else
            free(tmp[i]);
    }
    free(tmp);

    return rv;
}